

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_RsbUpdateAdd(Gia_RsbMan_t *p,int iObj)

{
  uint Entry;
  Vec_Int_t *pVVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  
  iVar3 = p->vObjs->nSize;
  bVar5 = (byte)iVar3;
  uVar2 = 1 << (bVar5 & 0x1f);
  if (p->vSets[0]->nSize != uVar2) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x563,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  if (p->vSets[1]->nSize != uVar2) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x564,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  if (iVar3 != 0x1f) {
    uVar6 = 1;
    if (1 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    uVar8 = 0;
    do {
      lVar10 = 0;
      do {
        p_00 = Vec_WecPushLevel(p->vSets[lVar10]);
        if ((long)p->vSets[lVar10]->nSize <= (long)uVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar1 = p->vSets[lVar10]->pArray;
        uVar2 = pVVar1[uVar8].nSize;
        uVar4 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar9 = 0;
        }
        else {
          lVar7 = 0;
          uVar9 = 0;
          do {
            uVar2 = p->nWords * iObj;
            if (((int)uVar2 < 0) || (p->vSims->nSize <= (int)uVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            Entry = pVVar1[uVar8].pArray[lVar7];
            if ((p->vSims->pArray[(ulong)uVar2 + (long)((int)Entry >> 6)] >> ((ulong)Entry & 0x3f) &
                1) == 0) {
              if (((int)uVar9 < 0) || ((int)uVar4 <= (int)uVar9)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar4 = (ulong)uVar9;
              uVar9 = uVar9 + 1;
              pVVar1[uVar8].pArray[uVar4] = Entry;
            }
            else {
              Vec_IntPush(p_00,Entry);
            }
            lVar7 = lVar7 + 1;
            uVar2 = pVVar1[uVar8].nSize;
            uVar4 = (ulong)(int)uVar2;
          } while (lVar7 < (long)uVar4);
        }
        if ((int)uVar2 < (int)uVar9) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        pVVar1[uVar8].nSize = uVar9;
        bVar11 = lVar10 == 0;
        lVar10 = lVar10 + 1;
      } while (bVar11);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
  }
  Vec_IntPush(p->vObjs,iObj);
  iVar3 = 2 << (bVar5 & 0x1f);
  if (p->vSets[0]->nSize != iVar3) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == 2*nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x577,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  if (p->vSets[1]->nSize != iVar3) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == 2*nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x578,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  return;
}

Assistant:

void Gia_RsbUpdateAdd( Gia_RsbMan_t * p, int iObj )
{
    int n, i, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == nLeaves );
    for ( i = 0; i < nLeaves; i++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            Vec_Int_t * vLevelN = Vec_WecPushLevel(p->vSets[n]);  
            Vec_Int_t * vLevel  = Vec_WecEntry(p->vSets[n], i);
            int iMint, j, k = 0;
            Vec_IntForEachEntry( vLevel, iMint, j )
            {
                if ( Abc_TtGetBit(Vec_WrdEntryP(p->vSims, p->nWords*iObj), iMint) )
                    Vec_IntPush( vLevelN, iMint );
                else
                    Vec_IntWriteEntry( vLevel, k++, iMint );
            }
            Vec_IntShrink( vLevel, k );
        }
    }
    Vec_IntPush( p->vObjs, iObj );
    assert( Vec_WecSize(p->vSets[0]) == 2*nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == 2*nLeaves );
}